

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestIsInitialized::~TestIsInitialized(TestIsInitialized *this)

{
  TestIsInitialized *this_local;
  
  ~TestIsInitialized(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TestIsInitialized::~TestIsInitialized() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestIsInitialized)
  SharedDtor(*this);
}